

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void jacobi_ek_compute(int n,double alpha,double beta,double *x,double *w)

{
  ulong uVar1;
  double *e;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar4 = exp2(alpha + beta + 1.0);
  dVar5 = r8_gamma(alpha + 1.0);
  dVar6 = r8_gamma(beta + 1.0);
  dVar7 = alpha + 2.0 + beta;
  dVar8 = r8_gamma(dVar7);
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  e = (double *)operator_new__(uVar2);
  *x = (beta - alpha) / dVar7;
  *e = ((alpha + 1.0) * 4.0 * (beta + 1.0)) / ((alpha + 3.0 + beta) * dVar7 * dVar7);
  uVar2 = (ulong)(uint)n;
  if (1 < n) {
    uVar3 = 1;
    do {
      uVar1 = uVar3 + 1;
      dVar9 = (double)(int)uVar1;
      dVar7 = dVar9 + dVar9 + alpha + beta;
      x[uVar3] = ((alpha + beta) * (beta - alpha)) / ((dVar7 + -2.0) * dVar7);
      e[uVar3] = ((dVar9 + alpha + beta) * (dVar9 + beta) * dVar9 * 4.0 * (dVar9 + alpha)) /
                 ((dVar7 + 1.0) * (dVar7 + -1.0) * dVar7 * dVar7);
      uVar3 = uVar1;
    } while (uVar2 != uVar1);
  }
  dVar8 = (dVar6 * dVar5 * dVar4) / dVar8;
  if (0 < n) {
    uVar3 = 0;
    do {
      dVar4 = e[uVar3];
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      e[uVar3] = dVar4;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  *w = dVar8;
  if (1 < n) {
    memset(w + 1,0,(ulong)(n - 1) << 3);
  }
  imtqlx(n,x,e,w);
  if (0 < n) {
    uVar3 = 0;
    do {
      w[uVar3] = w[uVar3] * w[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  operator_delete__(e);
  return;
}

Assistant:

void jacobi_ek_compute ( int n, double alpha, double beta, double x[], 
  double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_EK_COMPUTE: Elhay-Kautsky method for Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double abi;
  double *bj;
  int i;
  double i_r8;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = pow ( 2.0, alpha + beta + 1.0 )
    * r8_gamma ( alpha + 1.0 ) 
    * r8_gamma ( beta + 1.0 ) 
    / r8_gamma ( 2.0 + alpha + beta );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  x[0] = ( beta - alpha ) / ( 2.0 + alpha + beta );

  bj[0] = 4.0 * ( 1.0 + alpha ) * ( 1.0 + beta ) 
    / ( ( 3.0 + alpha + beta ) 
      * ( 2.0 + alpha + beta ) * ( 2.0 + alpha + beta ) );

  for ( i = 1; i < n; i++ )
  {
    i_r8 = double( i + 1 );
    abi = 2.0 * i_r8 + alpha + beta;
    x[i] = ( beta + alpha ) * ( beta - alpha ) / ( ( abi - 2.0 ) * abi );
    bj[i] = 4.0 * i_r8 * ( i_r8 + alpha ) * ( i_r8 + beta ) 
      * ( i_r8 + alpha + beta ) 
      / ( ( abi - 1.0 ) * ( abi + 1.0 ) * abi * abi );
  }

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( bj[i] );
  }

  w[0] = sqrt ( zemu );

  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}